

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

int adt_str_charAt(adt_str_t *self,int index)

{
  int local_20;
  char local_19;
  int32_t s32Index;
  adt_error_t errorCode;
  int retval;
  int index_local;
  adt_str_t *self_local;
  
  s32Index = -1;
  local_19 = '\0';
  if (self != (adt_str_t *)0x0) {
    if (index < 0) {
      local_20 = -index;
      if (self->s32Cur < local_20) {
        local_19 = '\x03';
      }
      else {
        local_20 = self->s32Cur + index;
      }
    }
    else {
      local_20 = index;
      if (self->s32Cur <= index) {
        local_19 = '\x03';
      }
    }
    if (local_19 == '\0') {
      s32Index = (int32_t)self->pAlloc[local_20];
    }
    else {
      self->lastError = local_19;
    }
  }
  return s32Index;
}

Assistant:

int adt_str_charAt(adt_str_t *self, int index)
{
   int retval = -1;
   adt_error_t errorCode = ADT_NO_ERROR;
   if(self != 0)
   {
      int32_t s32Index;
      if(index < 0)
      {
         s32Index=(int32_t) (-index);
         if(s32Index <= self->s32Cur)
         {
            s32Index = self->s32Cur-s32Index;
         }
         else
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      else
      {
         s32Index = (int32_t) index;
         if(s32Index >= self->s32Cur)
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      if (errorCode == ADT_NO_ERROR)
      {
         retval = (int) self->pAlloc[s32Index];
      }
      else
      {
         self->lastError = errorCode;
      }
   }
   return retval;

}